

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsBuilder.cpp
# Opt level: O1

void __thiscall
Refal2::COperationsBuilder::AddMatchLeft_V
          (COperationsBuilder *this,CQualifier *qualifier,bool saveInTable)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  TQualifierIndex pCVar4;
  COperationsBuilder *pCVar5;
  COperation local_28;
  
  bVar3 = CQualifier::IsEmpty(qualifier);
  if (bVar3) {
    iVar2 = this->stackDepth;
    iVar1 = iVar2 + 1;
    this->stackDepth = iVar1;
    if (saveInTable) {
      if (this->maxRuleStackDepth <= iVar2) {
        this->maxRuleStackDepth = iVar1;
      }
      local_28.type = OT_MatchLeftBeginSaveToTable_V;
      CNodeList<Refal2::COperation>::Append(&this->operations,&local_28);
      local_28.type = OT_MatchLeftSaveToTable_E;
    }
    else {
      if (this->maxRuleStackDepth <= iVar2) {
        this->maxRuleStackDepth = iVar1;
      }
      local_28.type = OT_MatchLeftBegin_V;
      CNodeList<Refal2::COperation>::Append(&this->operations,&local_28);
      local_28.type = OT_MatchLeft_E;
    }
    CNodeList<Refal2::COperation>::Append(&this->operations,&local_28);
  }
  else {
    if (saveInTable) {
      pCVar5 = this;
      addOperation_VE(this,OT_MatchLeftWithQulifierBeginSaveToTable_V,qualifier);
      pCVar4 = registerQualifier(pCVar5,qualifier);
      local_28.type = OT_MatchLeftWithQulifierSaveToTable_E;
    }
    else {
      pCVar5 = this;
      addOperation_VE(this,OT_MatchLeftWithQulifierBegin_V,qualifier);
      pCVar4 = registerQualifier(pCVar5,qualifier);
      local_28.type = OT_MatchLeftWithQulifier_E;
    }
    CNodeList<Refal2::COperation>::Append(&this->operations,&local_28);
    (((this->operations).last)->super_COperation).field_1.qualifier = pCVar4;
  }
  return;
}

Assistant:

void COperationsBuilder::AddMatchLeft_V( CQualifier& qualifier,
	bool saveInTable )
{
	DEBUG_PRINT( __FUNCTION__ )
	if( qualifier.IsEmpty() ) {
		if( saveInTable ) {
			addOperation_VE( OT_MatchLeftBeginSaveToTable_V );
			addNoArgumensOperation( OT_MatchLeftSaveToTable_E );
		} else {
			addOperation_VE( OT_MatchLeftBegin_V );
			addNoArgumensOperation( OT_MatchLeft_E );
		}
	} else {
		if( saveInTable ) {
			addOperation_VE( OT_MatchLeftWithQulifierBeginSaveToTable_V,
				qualifier );
			addQualifierIndexOperation( OT_MatchLeftWithQulifierSaveToTable_E,
				qualifier );
		} else {
			addOperation_VE( OT_MatchLeftWithQulifierBegin_V, qualifier );
			addQualifierIndexOperation( OT_MatchLeftWithQulifier_E, qualifier );
		}
	}
}